

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeHideHostWindow(ImGuiDockNode *node)

{
  ImGuiWindow_conflict **ppIVar1;
  ImGuiDockNode *node_local;
  
  if (node->HostWindow != (ImGuiWindow_conflict *)0x0) {
    if (node->HostWindow->DockNodeAsHost == node) {
      node->HostWindow->DockNodeAsHost = (ImGuiDockNode *)0x0;
    }
    node->HostWindow = (ImGuiWindow_conflict *)0x0;
  }
  if ((node->Windows).Size == 1) {
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](&node->Windows,0);
    node->VisibleWindow = *ppIVar1;
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](&node->Windows,0);
    (*ppIVar1)->field_0x3e1 = (*ppIVar1)->field_0x3e1 & 0xfe;
  }
  if (node->TabBar != (ImGuiTabBar *)0x0) {
    DockNodeRemoveTabBar(node);
  }
  return;
}

Assistant:

static void ImGui::DockNodeHideHostWindow(ImGuiDockNode* node)
{
    if (node->HostWindow)
    {
        if (node->HostWindow->DockNodeAsHost == node)
            node->HostWindow->DockNodeAsHost = NULL;
        node->HostWindow = NULL;
    }

    if (node->Windows.Size == 1)
    {
        node->VisibleWindow = node->Windows[0];
        node->Windows[0]->DockIsActive = false;
    }

    if (node->TabBar)
        DockNodeRemoveTabBar(node);
}